

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool considerScaling(HighsOptions *options,HighsLp *lp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = lp->num_col_ < 1;
  iVar1 = (options->super_HighsOptionsStruct).simplex_scale_strategy;
  bVar5 = (lp->scale_).has_scaling;
  if ((~bVar5 & 1U) == 0 && (iVar1 == 0 || bVar4)) {
    HighsLp::clearScale(lp);
  }
  else {
    iVar2 = (lp->scale_).strategy;
    if ((iVar1 == 0 || bVar4) || (iVar1 == 1 || iVar1 == iVar2) && iVar2 != 0) {
      if (bVar5 != false) {
        HighsLp::applyScale(lp);
      }
      return false;
    }
    HighsLp::unapplyScale(lp);
    uVar3 = (options->super_HighsOptionsStruct).highs_analysis_level;
    if ((uVar3 & 1) != 0) {
      analyseLp(&(options->super_HighsOptionsStruct).log_options,lp);
    }
    bVar5 = (uVar3 & 1) == 0;
    scaleLp(options,lp,false);
    if ((~lp->is_scaled_ & 1U) != 0 || bVar5) {
      return (bool)(bVar5 & lp->is_scaled_);
    }
    analyseLp(&(options->super_HighsOptionsStruct).log_options,lp);
  }
  return true;
}

Assistant:

bool considerScaling(const HighsOptions& options, HighsLp& lp) {
  // Indicate whether new scaling has been determined in the return value.
  bool new_scaling = false;
  // Consider scaling the LP - either by finding new factors or by
  // applying any existing factors
  const bool allow_scaling =
      lp.num_col_ > 0 &&
      options.simplex_scale_strategy != kSimplexScaleStrategyOff;
  if (lp.scale_.has_scaling && !allow_scaling) {
    // LP had scaling before, but now it is not permitted, clear any
    // scaling. Return true as scaling position has changed
    lp.clearScale();
    return true;
  }
  const bool scaling_not_tried = lp.scale_.strategy == kSimplexScaleStrategyOff;
  const bool new_scaling_strategy =
      options.simplex_scale_strategy != lp.scale_.strategy &&
      options.simplex_scale_strategy != kSimplexScaleStrategyChoose;
  const bool try_scaling =
      allow_scaling && (scaling_not_tried || new_scaling_strategy);
  if (try_scaling) {
    // Scaling will be tried, so ensure that any previous scaling is not applied
    lp.unapplyScale();
    const bool analyse_lp_data =
        kHighsAnalysisLevelModelData & options.highs_analysis_level;
    if (analyse_lp_data) analyseLp(options.log_options, lp);
    scaleLp(options, lp);
    // If the LP is now scaled, then the scaling is new
    new_scaling = lp.is_scaled_;
    if (analyse_lp_data && lp.is_scaled_) analyseLp(options.log_options, lp);
  } else if (lp.scale_.has_scaling) {
    // Scaling factors are known, so ensure that they are applied
    lp.applyScale();
  }
  // Ensure that either the LP has scale factors and is scaled, or
  // it doesn't have scale factors and isn't scaled
  assert(lp.scale_.has_scaling == lp.is_scaled_);
  return new_scaling;
}